

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxautopr.h
# Opt level: O0

void __thiscall soplex::SPxAutoPR<double>::SPxAutoPR(SPxAutoPR<double> *this,SPxAutoPR<double> *old)

{
  SPxPricer<double> *in_RSI;
  SPxDevexPR<double> *in_RDI;
  SPxDevexPR<double> *unaff_retaddr;
  SPxSteepExPR<double> *in_stack_ffffffffffffffc8;
  SPxPricer<double> *in_stack_ffffffffffffffe8;
  SPxDevexPR<double> *old_00;
  
  old_00 = in_RDI;
  SPxPricer<double>::SPxPricer(in_RSI,in_stack_ffffffffffffffe8);
  (((SPxSteepPR<double> *)&in_RDI->super_SPxPricer<double>)->super_SPxPricer<double>).
  _vptr_SPxPricer = (_func_int **)&PTR_getName_00898890;
  *(undefined4 *)&(((SSVectorBase<double> *)&in_RDI->last)->super_IdxSet)._vptr_IdxSet =
       *(undefined4 *)&in_RSI[1]._vptr_SPxPricer;
  SPxDevexPR<double>::SPxDevexPR(unaff_retaddr,old_00);
  SPxSteepExPR<double>::SPxSteepExPR((SPxSteepExPR<double> *)in_RDI,in_stack_ffffffffffffffc8);
  if ((SPxSolverBase<double> **)in_RSI[1].m_name == &in_RSI[1].thesolver) {
    (in_RDI->prices).data.
    super__Vector_base<soplex::SPxPricer<double>::IdxElement,_std::allocator<soplex::SPxPricer<double>::IdxElement>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)&(in_RDI->prices).data.
                   super__Vector_base<soplex::SPxPricer<double>::IdxElement,_std::allocator<soplex::SPxPricer<double>::IdxElement>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    (in_RDI->prices).data.
    super__Vector_base<soplex::SPxPricer<double>::IdxElement,_std::allocator<soplex::SPxPricer<double>::IdxElement>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)&in_RDI[1].prices.data.
                   super__Vector_base<soplex::SPxPricer<double>::IdxElement,_std::allocator<soplex::SPxPricer<double>::IdxElement>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
  }
  return;
}

Assistant:

SPxAutoPR(const SPxAutoPR& old)
      : SPxPricer<R>(old)
      , switchIters(old.switchIters)
      , devex(old.devex)
      , steep(old.steep)
   {
      assert(old.activepricer == &old.devex || old.activepricer == &old.steep);

      if(old.activepricer == &old.devex)
         activepricer = &devex;
      else
         activepricer = &steep;
   }